

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O3

void __thiscall FMemArena::FreeAll(FMemArena *this)

{
  Block *pBVar1;
  Block *pBVar2;
  Block *pBVar3;
  
  if (this->TopBlock != (Block *)0x0) {
    pBVar1 = this->TopBlock;
    pBVar3 = this->FreeBlocks;
    do {
      pBVar2 = pBVar1;
      pBVar1 = pBVar2->NextBlock;
      pBVar2->Avail = pBVar2 + 0x18;
      pBVar2->NextBlock = pBVar3;
      pBVar3 = pBVar2;
    } while (pBVar1 != (Block *)0x0);
    this->FreeBlocks = pBVar2;
  }
  this->TopBlock = (Block *)0x0;
  return;
}

Assistant:

void FMemArena::FreeAll()
{
	for (Block *next, *block = TopBlock; block != NULL; block = next)
	{
		next = block->NextBlock;
		block->Reset();
		block->NextBlock = FreeBlocks;
		FreeBlocks = block;
	}
	TopBlock = NULL;
}